

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void luaV_finishget(lua_State *L,TValue *t,TValue *key,StkId val,TValue *slot)

{
  Table *events;
  undefined4 uVar1;
  uint uVar2;
  TValue *f;
  TValue *io1;
  int iVar3;
  bool bVar4;
  
  iVar3 = 2000;
  do {
    bVar4 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar4) {
      luaG_runerror(L,"\'__index\' chain too long; possible loop");
    }
    if (slot == (TValue *)0x0) {
      f = luaT_gettmbyobj(L,t,TM_INDEX);
      uVar2 = f->tt_;
      if (uVar2 == 0) {
        luaG_typeerror(L,t,"index");
      }
    }
    else {
      events = *(Table **)((t->value_).f + 0x28);
      if (((events == (Table *)0x0) || ((events->flags & 1) != 0)) ||
         (f = luaT_gettm(events,TM_INDEX,L->l_G->tmname[0]), f == (TValue *)0x0)) {
        val->tt_ = 0;
        return;
      }
      uVar2 = f->tt_;
    }
    if ((uVar2 & 0xf) == 6) {
      luaT_callTM(L,f,t,key,val,1);
      return;
    }
    t = f;
    if (uVar2 == 0x45) {
      slot = luaH_get((Table *)(f->value_).gc,key);
      if (slot->tt_ != 0) {
        iVar3 = slot->tt_;
        uVar1 = *(undefined4 *)&slot->field_0xc;
        val->value_ = slot->value_;
        val->tt_ = iVar3;
        *(undefined4 *)&val->field_0xc = uVar1;
        return;
      }
    }
    else {
      slot = (TValue *)0x0;
    }
  } while( true );
}

Assistant:

void luaV_finishget(lua_State *L, const TValue *t, TValue *key, StkId val,
                    const TValue *slot) {
    int loop;  /* counter to avoid infinite loops */
    const TValue *tm;  /* metamethod */
    for (loop = 0; loop < MAXTAGLOOP; loop++) {
        if (slot == NULL) {  /* 't' is not a table? */
            lua_assert(!ttistable(t));
            tm = luaT_gettmbyobj(L, t, TM_INDEX);
            if (ttisnil(tm))
                luaG_typeerror(L, t, "index");  /* no metamethod */
            /* else will try the metamethod */
        } else {  /* 't' is a table */
            lua_assert(ttisnil(slot));
            tm = fasttm(L, hvalue(t)->metatable, TM_INDEX);  /* table's metamethod */
            if (tm == NULL) {  /* no metamethod? */
                setnilvalue(val);  /* result is nil */
                return;
            }
            /* else will try the metamethod */
        }
        if (ttisfunction(tm)) {  /* is metamethod a function? */
            luaT_callTM(L, tm, t, key, val, 1);  /* call it */
            return;
        }
        t = tm;  /* else try to access 'tm[key]' */
        if (luaV_fastget(L, t, key, slot, luaH_get)) {  /* fast track? */
            setobj2s(L, val, slot);  /* done */
            return;
        }
        /* else repeat (tail call 'luaV_finishget') */
    }
    luaG_runerror(L, "'__index' chain too long; possible loop");
}